

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O1

void * operator_new__(size_t size,nothrow_t *param_2)

{
  byte bVar1;
  int byte_size;
  ThreadCache *this;
  undefined8 *puVar2;
  bool bVar3;
  void *pvVar4;
  FreeList *pFVar5;
  uint in_EDX;
  uint uVar6;
  undefined8 *in_FS_OFFSET;
  
  if ((base::internal::new_hooks_ != 0) ||
     (this = (ThreadCache *)*in_FS_OFFSET, this == (ThreadCache *)0x0)) goto LAB_0010e709;
  if (size < 0x401) {
    in_EDX = (int)size + 7U >> 3;
LAB_0010e6ad:
    bVar3 = true;
  }
  else {
    if (size < 0x40001) {
      in_EDX = (int)size + 0x3c7fU >> 7;
      goto LAB_0010e6ad;
    }
    bVar3 = false;
  }
  if (bVar3) {
    bVar1 = (&tcmalloc::Static::sizemap_)[in_EDX];
    byte_size = this->list_[bVar1].size_;
    puVar2 = (undefined8 *)this->list_[bVar1].list_;
    if (puVar2 != (undefined8 *)0x0) {
      pFVar5 = this->list_ + bVar1;
      pFVar5->list_ = (void *)*puVar2;
      uVar6 = pFVar5->length_ - 1;
      pFVar5->length_ = uVar6;
      if (uVar6 < pFVar5->lowater_) {
        pFVar5->lowater_ = uVar6;
      }
      if (puVar2 != (undefined8 *)0x0) {
        this->size_ = this->size_ - byte_size;
        return puVar2;
      }
    }
    pvVar4 = tcmalloc::ThreadCache::FetchFromCentralCache
                       (this,(uint)bVar1,byte_size,tcmalloc::cpp_nothrow_oom);
    return pvVar4;
  }
LAB_0010e709:
  pvVar4 = tcmalloc::allocate_full_cpp_nothrow_oom(size);
  return pvVar4;
}

Assistant:

PERFTOOLS_DLL_DECL CACHELINE_ALIGNED_FN
void* tc_new_nothrow(size_t size, const std::nothrow_t&) PERFTOOLS_NOTHROW {
  return malloc_fast_path<tcmalloc::cpp_nothrow_oom>(size);
}